

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O0

void __thiscall merlin::variable_set::variable_set(variable_set *this,variable *v,variable *v2)

{
  size_t sVar1;
  size_t sVar2;
  reference pvVar3;
  allocator<unsigned_long> local_35 [20];
  allocator<unsigned_long> local_21;
  variable *local_20;
  variable *v2_local;
  variable *v_local;
  variable_set *this_local;
  
  local_20 = v2;
  v2_local = v;
  v_local = (variable *)this;
  std::allocator<unsigned_long>::allocator(&local_21);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_v,2,&local_21);
  std::allocator<unsigned_long>::~allocator(&local_21);
  std::allocator<unsigned_long>::allocator(local_35);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_dlocal,2,local_35);
  std::allocator<unsigned_long>::~allocator(local_35);
  sVar1 = variable::label(v2_local);
  sVar2 = variable::label(local_20);
  if (sVar1 < sVar2) {
    sVar1 = variable::label(v2_local);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->m_v,0);
    *pvVar3 = sVar1;
    sVar1 = variable::states(v2_local);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_dlocal,0);
    *pvVar3 = sVar1;
    sVar1 = variable::label(local_20);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->m_v,1);
    *pvVar3 = sVar1;
    sVar1 = variable::states(local_20);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_dlocal,1);
    *pvVar3 = sVar1;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_dlocal,0);
    this->m_d = pvVar3;
  }
  else {
    sVar1 = variable::label(local_20);
    sVar2 = variable::label(v2_local);
    if (sVar1 < sVar2) {
      sVar1 = variable::label(v2_local);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->m_v,1);
      *pvVar3 = sVar1;
      sVar1 = variable::states(v2_local);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_dlocal,1);
      *pvVar3 = sVar1;
      sVar1 = variable::label(local_20);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->m_v,0);
      *pvVar3 = sVar1;
      sVar1 = variable::states(local_20);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_dlocal,0);
      *pvVar3 = sVar1;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_dlocal,0);
      this->m_d = pvVar3;
    }
    else {
      sVar1 = variable::label(v2_local);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->m_v,0);
      *pvVar3 = sVar1;
      sVar1 = variable::states(v2_local);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_dlocal,0);
      *pvVar3 = sVar1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->m_v,1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->m_dlocal,1);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_dlocal,0);
      this->m_d = pvVar3;
    }
  }
  return;
}

Assistant:

variable_set(const variable& v, const variable& v2) :
			m_v(2), m_dlocal(2) {
		if (v.label() < v2.label()) {
			m_v[0] = v.label();
			m_dlocal[0] = v.states();
			m_v[1] = v2.label();
			m_dlocal[1] = v2.states();
			m_d = &m_dlocal[0];
		} else if (v2.label() < v.label()) {
			m_v[1] = v.label();
			m_dlocal[1] = v.states();
			m_v[0] = v2.label();
			m_dlocal[0] = v2.states();
			m_d = &m_dlocal[0];
		} else {
			m_v[0] = v.label();
			m_dlocal[0] = v.states();
			m_v.resize(1);
			m_dlocal.resize(1);
			m_d = &m_dlocal[0];
		}
	}